

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<ClassDef>::reallocateAndGrow
          (QArrayDataPointer<ClassDef> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<ClassDef> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  ClassDef *pCVar3;
  bool bVar4;
  long lVar5;
  qsizetype qVar6;
  ClassDef *pCVar7;
  ClassDef *pCVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<ClassDef> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<ClassDef> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar6 = 0;
        lVar5 = 0;
      }
      else {
        qVar6 = pQVar1->alloc;
        lVar5 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                0x21cfb2b78c13521d;
      }
      auVar9 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x1a8,qVar6 + n + lVar5,Grow);
      this->d = (Data *)auVar9._0_8_;
      this->ptr = (ClassDef *)auVar9._8_8_;
      goto LAB_0012a154;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (ClassDef *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pCVar3 = local_48.ptr;
  if (this->size != 0) {
    lVar5 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pCVar8 = this->ptr;
    pCVar7 = pCVar8 + lVar5;
    if ((old != (QArrayDataPointer<ClassDef> *)0x0) || (bVar4)) {
      if ((lVar5 != 0) && (0 < lVar5)) {
        do {
          ClassDef::ClassDef(pCVar3 + local_48.size,pCVar8);
          pCVar8 = pCVar8 + 1;
          local_48.size = local_48.size + 1;
        } while (pCVar8 < pCVar7);
      }
    }
    else if ((lVar5 != 0) && (0 < lVar5)) {
      do {
        ClassDef::ClassDef(pCVar3 + local_48.size,pCVar8);
        pCVar8 = pCVar8 + 1;
        local_48.size = local_48.size + 1;
      } while (pCVar8 < pCVar7);
    }
  }
  pDVar2 = this->d;
  pCVar3 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar6 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar2;
  local_48.ptr = pCVar3;
  local_48.size = qVar6;
  if (old != (QArrayDataPointer<ClassDef> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = pDVar2;
    old->ptr = pCVar3;
    local_48.size = old->size;
    old->size = qVar6;
  }
  ~QArrayDataPointer(&local_48);
LAB_0012a154:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }